

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O1

void r8poly_print(int n,double *a,string *title)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  ulong uVar6;
  double dVar7;
  char local_36;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  if (title->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(title->_M_dataplus)._M_p,title->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  if (n < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  p(x) = 0\n",0xb);
    return;
  }
  cVar5 = ' ';
  if (a[(uint)n] < 0.0) {
    cVar5 = '-';
  }
  dVar7 = ABS(a[(uint)n]);
  if (n < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  p(x) = ",9);
    if (n == 1) {
      local_35 = cVar5;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_35,1)
      ;
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0xe;
      poVar2 = std::ostream::_M_insert<double>(dVar7);
      pcVar4 = " * x\n";
      lVar3 = 5;
      goto LAB_001cb7aa;
    }
    local_36 = cVar5;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_36,1);
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0xe;
    poVar2 = std::ostream::_M_insert<double>(dVar7);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  p(x) = ",9);
    local_34 = cVar5;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_34,1);
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0xe;
    poVar2 = std::ostream::_M_insert<double>(dVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," * x ^ ",7);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,n);
  }
  pcVar4 = "\n";
  lVar3 = 1;
LAB_001cb7aa:
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  if (n != 0) {
    uVar6 = (ulong)(n - 1);
    do {
      dVar7 = a[uVar6];
      if ((dVar7 != 0.0) || (NAN(dVar7))) {
        cVar5 = (dVar7 < 0.0) * '\x02' + '+';
        dVar7 = ABS(dVar7);
        if (n < 3) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
          if (n != 2) {
            local_33 = cVar5;
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,&local_33,1);
            *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0xe;
            poVar2 = std::ostream::_M_insert<double>(dVar7);
            goto LAB_001cb8eb;
          }
          local_32 = cVar5;
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,&local_32,1);
          *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0xe;
          poVar2 = std::ostream::_M_insert<double>(dVar7);
          lVar3 = 5;
          pcVar4 = " * x\n";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
          local_31 = cVar5;
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,&local_31,1);
          *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0xe;
          poVar2 = std::ostream::_M_insert<double>(dVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," * x ^ ",7);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar6);
LAB_001cb8eb:
          lVar3 = 1;
          pcVar4 = "\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
      }
      uVar6 = uVar6 - 1;
      bVar1 = 1 < n;
      n = n + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void r8poly_print ( int n, double a[], std::string title )

//****************************************************************************80
//
//  Purpose:
//
//    R8POLY_PRINT prints out a polynomial.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 July 2015
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the dimension of A.
//
//    Input, double A[N+1], the polynomial coefficients.
//    A(0) is the constant term and
//    A(N) is the coefficient of X^N.
//
//    Input, string TITLE, a title.
//
{
  int i;
  double mag;
  char plus_minus;

  if ( 0 < title.length ( ) )
  {
    std::cout << "\n";
    std::cout << title << "\n";
  }
  std::cout << "\n";

  if ( n < 0 )
  {
    std::cout << "  p(x) = 0\n";
    return;
  }

  if ( a[n] < 0.0 )
  {
    plus_minus = '-';
  }
  else
  {
    plus_minus = ' ';
  }

  mag = fabs ( a[n] );

  if ( 2 <= n )
  {
    std::cout << "  p(x) = " << plus_minus
         << std::setw(14) << mag << " * x ^ " << n << "\n";
  }
  else if ( n == 1 )
  {
    std::cout << "  p(x) = " << plus_minus
         << std::setw(14) << mag << " * x\n";
  }
  else if ( n == 0 )
  {
    std::cout << "  p(x) = " << plus_minus
         << std::setw(14) << mag << "\n";
  }

  for ( i = n - 1; 0 <= i; i-- )
  {
    if ( a[i] < 0.0 )
    {
      plus_minus = '-';
    }
    else
    {
      plus_minus = '+';
    }

    mag = fabs ( a[i] );

    if ( mag != 0.0 )
    {
      if ( 2 <= i )
      {
        std::cout << "         " << plus_minus
             << std::setw(14) << mag << " * x ^ " << i << "\n";
      }
      else if ( i == 1 )
      {
        std::cout << "         " << plus_minus
             << std::setw(14) << mag << " * x\n";
      }
      else if ( i == 0 )
      {
        std::cout << "         " << plus_minus
             << std::setw(14) << mag << "\n";
      }
    }
  }

  return;
}